

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::bt_peer_connection::on_bitfield(bt_peer_connection *this,int received)

{
  _Atomic_word *p_Var1;
  crypto_receive_buffer *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Head_base<0UL,_unsigned_int_*,_false> _Var3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *ptVar7;
  int iVar8;
  uint bits;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar9;
  bool bVar10;
  span<const_char> sVar11;
  error_code local_40;
  
  p_Var2 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    peVar9 = (element_type *)0x0;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    peVar9 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
             super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
    }
    iVar6 = p_Var2->_M_use_count;
    do {
      if (iVar6 == 0) {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        peVar9 = (element_type *)0x0;
        goto LAB_0018a6fd;
      }
      LOCK();
      iVar8 = p_Var2->_M_use_count;
      bVar10 = iVar6 == iVar8;
      if (bVar10) {
        p_Var2->_M_use_count = iVar6 + 1;
        iVar8 = iVar6;
      }
      iVar6 = iVar8;
      UNLOCK();
    } while (!bVar10);
    this_01 = p_Var2;
    if (p_Var2->_M_use_count == 0) {
      peVar9 = (element_type *)0x0;
    }
LAB_0018a6fd:
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar6 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar6 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar6 + -1;
    }
    if (iVar6 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  if (0 < (((peVar9->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length) {
    iVar5 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
    iVar8 = (((peVar9->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_files).m_num_pieces;
    iVar6 = iVar8 + 7;
    iVar8 = iVar8 + 0xe;
    if (-1 < iVar6) {
      iVar8 = iVar6;
    }
    if (iVar5 + -1 != iVar8 >> 3) {
      local_40 = errors::make_error_code(invalid_bitfield_size);
      (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                (this,&local_40,1,2);
      goto LAB_0018a813;
    }
  }
  this_00 = &this->m_recv_buffer;
  bVar10 = crypto_receive_buffer::packet_finished(this_00);
  if (bVar10) {
    sVar11 = crypto_receive_buffer::get(this_00);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_40.cat_;
    local_40 = (error_code)(auVar4 << 0x40);
    if ((((peVar9->super_torrent_hot_members).m_torrent_file.
          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files)
        .m_piece_length < 1) {
      iVar6 = crypto_receive_buffer::packet_size(this_00);
      bits = iVar6 * 8 - 8;
    }
    else {
      ptVar7 = peer_connection::get_bitfield(&this->super_peer_connection);
      _Var3._M_head_impl =
           *(uint **)&(ptVar7->super_bitfield).m_buf.
                      super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t
                      .super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
      if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var3._M_head_impl ==
          (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
        bits = 0;
      }
      else {
        bits = *_Var3._M_head_impl;
      }
    }
    bitfield::assign((bitfield *)&local_40,sVar11.m_ptr + 1,bits);
    peer_connection::incoming_bitfield
              (&this->super_peer_connection,
               (typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                *)&local_40);
    if ((void *)local_40._0_8_ != (void *)0x0) {
      operator_delete__((void *)local_40._0_8_);
    }
  }
LAB_0018a813:
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void bt_peer_connection::on_bitfield(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		received_bytes(0, received);
		// if we don't have the metadata, we cannot
		// verify the bitfield size
		if (t->valid_metadata()
			&& m_recv_buffer.packet_size() - 1 != (t->torrent_file().num_pieces() + CHAR_BIT - 1) / CHAR_BIT)
		{
			disconnect(errors::invalid_bitfield_size, operation_t::bittorrent, peer_error);
			return;
		}

		if (!m_recv_buffer.packet_finished()) return;

		span<char const> recv_buffer = m_recv_buffer.get();

		typed_bitfield<piece_index_t> bits;
		bits.assign(recv_buffer.data() + 1
			, t->valid_metadata()?get_bitfield().size():(m_recv_buffer.packet_size()-1)*CHAR_BIT);

		incoming_bitfield(bits);
	}